

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSegment.cpp
# Opt level: O0

void __thiscall
vectorgraphics::LineSegment3D::LineSegment3D
          (LineSegment3D *this,double start_x,double start_y,double start_z,double end_x,
          double end_y,double end_z)

{
  double end_z_local;
  double end_y_local;
  double end_x_local;
  double start_z_local;
  double start_y_local;
  double start_x_local;
  LineSegment3D *this_local;
  
  end_z_local = end_y;
  end_y_local = end_x;
  end_x_local = start_z;
  start_z_local = start_y;
  start_y_local = start_x;
  start_x_local = (double)this;
  Primitive::Primitive(&this->super_Primitive);
  std::make_shared<vectorgraphics::Point3D,double&,double&,double&>
            ((double *)&this->start_ptr_,&start_y_local,&start_z_local);
  std::make_shared<vectorgraphics::Point3D,double&,double&,double&>
            ((double *)&this->end_ptr_,&end_y_local,&end_z_local);
  return;
}

Assistant:

LineSegment3D::LineSegment3D(double start_x, double start_y, double start_z, double end_x, double end_y, double end_z) : 
    start_ptr_(std::make_shared<Point3D>(start_x, start_y, start_z)), 
    end_ptr_(std::make_shared<Point3D>(end_x, end_y, end_z)) {
  }